

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

void http1_on_data(intptr_t uuid,fio_protocol_s *protocol)

{
  long local_28;
  ssize_t i;
  http1pr_s *p;
  fio_protocol_s *protocol_local;
  intptr_t uuid_local;
  
  if (*(char *)((long)&protocol[5].on_shutdown + 2) == '\0') {
    local_28 = 0;
    if (protocol[4].rsv != 0x2000) {
      local_28 = fio_read(uuid,(void *)((long)&protocol[5].on_shutdown + protocol[4].rsv + 3),
                          0x2000 - protocol[4].rsv);
    }
    if (0 < local_28) {
      protocol[4].rsv = local_28 + protocol[4].rsv;
    }
    http1_consume_data(uuid,(http1pr_s *)protocol);
  }
  else {
    fio_suspend(uuid);
  }
  return;
}

Assistant:

static void http1_on_data(intptr_t uuid, fio_protocol_s *protocol) {
  http1pr_s *p = (http1pr_s *)protocol;
  if (p->stop) {
    fio_suspend(uuid);
    return;
  }
  ssize_t i = 0;
  if (HTTP_MAX_HEADER_LENGTH - p->buf_len)
    i = fio_read(uuid, p->buf + p->buf_len,
                 HTTP_MAX_HEADER_LENGTH - p->buf_len);
  if (i > 0) {
    p->buf_len += i;
  }
  http1_consume_data(uuid, p);
}